

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walltime.cc
# Opt level: O0

bool benchmark::walltime::anon_unknown_1::UseCpuCycleClock(void)

{
  bool bVar1;
  ostream *poVar2;
  bool useWallTime;
  
  bVar1 = CpuScalingEnabled();
  bVar1 = (bool)((bVar1 ^ 0xffU) & 1);
  if (bVar1 == false) {
    poVar2 = internal::GetLogInstanceForLevel(1);
    poVar2 = std::operator<<(poVar2,"-- LOG(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
    poVar2 = std::operator<<(poVar2,"): ");
    std::operator<<(poVar2,"Using std::chrono to provide walltime::Now().\n");
  }
  else {
    poVar2 = internal::GetLogInstanceForLevel(1);
    poVar2 = std::operator<<(poVar2,"-- LOG(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
    poVar2 = std::operator<<(poVar2,"): ");
    std::operator<<(poVar2,"Using the CPU cycle clock to provide walltime::Now().\n");
  }
  return bVar1;
}

Assistant:

bool UseCpuCycleClock() {
    bool useWallTime = !CpuScalingEnabled();
    if (useWallTime) {
        VLOG(1) << "Using the CPU cycle clock to provide walltime::Now().\n";
    } else {
        VLOG(1) << "Using std::chrono to provide walltime::Now().\n";
    }
    return useWallTime;
}